

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Effects.cpp
# Opt level: O1

void Sparkle(byte red,byte green,byte blue,int SpeedDelay)

{
  uint7 uVar1;
  undefined8 uVar2;
  int iVar3;
  undefined8 in_RAX;
  long lVar4;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  lVar4 = random();
  uVar2 = uStack_28;
  iVar3 = (int)((double)lVar4 * 24.0 * 4.656612873077393e-10);
  uStack_28._5_3_ = SUB83(uVar2,5);
  uStack_28._0_5_ = CONCAT14(blue,CONCAT13(green,CONCAT12(red,(undefined2)uStack_28)));
  iVar3 = iVar3 + (((uint)(iVar3 / 6 + (iVar3 >> 0x1f)) >> 2) - (iVar3 >> 0x1f)) * -0x18;
  WS2812B::Led::setColor(&leds,(RGB *)((long)&uStack_28 + 2),iVar3);
  WS2812B::Led::show(&leds);
  usleep(SpeedDelay * 1000);
  uVar1 = (uint7)uStack_28;
  uStack_28 = (ulong)(uVar1 & 0xffffffffff);
  WS2812B::Led::setColor(&leds,(RGB *)((long)&uStack_28 + 5),iVar3);
  return;
}

Assistant:

void Sparkle(byte red, byte green, byte blue, int SpeedDelay) {
    int Pixel =myRandom(0, NUM_LEDS);
    setPixel(Pixel,red,green,blue);
    showStrip();
    delay(SpeedDelay);
    setPixel(Pixel,0,0,0);
}